

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# lstrlib.cpp
# Opt level: O0

void addquoted(lua_State *L,luaL_Buffer *b,int arg)

{
  char cVar1;
  size_t sVar2;
  int iVar3;
  char *pcVar4;
  char local_3a [8];
  char buff [10];
  char *s;
  size_t l;
  luaL_Buffer *plStack_18;
  int arg_local;
  luaL_Buffer *b_local;
  lua_State *L_local;
  
  l._4_4_ = arg;
  plStack_18 = b;
  b_local = (luaL_Buffer *)L;
  buff._2_8_ = luaL_checklstring(L,arg,(size_t *)&s);
  if (plStack_18->size <= plStack_18->n) {
    luaL_prepbuffsize(plStack_18,1);
  }
  sVar2 = plStack_18->n;
  plStack_18->n = sVar2 + 1;
  plStack_18->b[sVar2] = '\"';
  while (pcVar4 = s + -1, s != (char *)0x0) {
    if (((*(char *)buff._2_8_ == '\"') || (*(char *)buff._2_8_ == '\\')) ||
       (*(char *)buff._2_8_ == '\n')) {
      s = pcVar4;
      if (plStack_18->size <= plStack_18->n) {
        luaL_prepbuffsize(plStack_18,1);
      }
      sVar2 = plStack_18->n;
      plStack_18->n = sVar2 + 1;
      plStack_18->b[sVar2] = '\\';
      if (plStack_18->size <= plStack_18->n) {
        luaL_prepbuffsize(plStack_18,1);
      }
      cVar1 = *(char *)buff._2_8_;
      sVar2 = plStack_18->n;
      plStack_18->n = sVar2 + 1;
      plStack_18->b[sVar2] = cVar1;
    }
    else {
      s = pcVar4;
      if ((*(char *)buff._2_8_ == '\0') || (iVar3 = iscntrl((uint)*(byte *)buff._2_8_), iVar3 != 0))
      {
        iVar3 = isdigit((uint)*(byte *)(buff._2_8_ + 1));
        if (iVar3 == 0) {
          sprintf(local_3a,"\\%d",(ulong)*(byte *)buff._2_8_);
        }
        else {
          sprintf(local_3a,"\\%03d",(ulong)*(byte *)buff._2_8_);
        }
        luaL_addstring(plStack_18,local_3a);
      }
      else {
        if (plStack_18->size <= plStack_18->n) {
          luaL_prepbuffsize(plStack_18,1);
        }
        cVar1 = *(char *)buff._2_8_;
        sVar2 = plStack_18->n;
        plStack_18->n = sVar2 + 1;
        plStack_18->b[sVar2] = cVar1;
      }
    }
    buff._2_8_ = buff._2_8_ + 1;
  }
  if (plStack_18->size <= plStack_18->n) {
    s = pcVar4;
    luaL_prepbuffsize(plStack_18,1);
  }
  sVar2 = plStack_18->n;
  plStack_18->n = sVar2 + 1;
  plStack_18->b[sVar2] = '\"';
  return;
}

Assistant:

static void addquoted (lua_State *L, luaL_Buffer *b, int arg) {
  size_t l;
  const char *s = luaL_checklstring(L, arg, &l);
  luaL_addchar(b, '"');
  while (l--) {
    if (*s == '"' || *s == '\\' || *s == '\n') {
      luaL_addchar(b, '\\');
      luaL_addchar(b, *s);
    }
    else if (*s == '\0' || iscntrl(uchar(*s))) {
      char buff[10];
      if (!isdigit(uchar(*(s+1))))
        sprintf(buff, "\\%d", (int)uchar(*s));
      else
        sprintf(buff, "\\%03d", (int)uchar(*s));
      luaL_addstring(b, buff);
    }
    else
      luaL_addchar(b, *s);
    s++;
  }
  luaL_addchar(b, '"');
}